

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# append_data.hpp
# Opt level: O1

void duckdb::AppendValidity
               (ArrowAppendData *append_data,UnifiedVectorFormat *format,idx_t from,idx_t to)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  reference pvVar4;
  byte bVar5;
  ulong uVar6;
  idx_t iVar7;
  bool bVar8;
  
  pvVar4 = vector<duckdb::ArrowBuffer,_true>::operator[](&append_data->arrow_buffers,0);
  ResizeValidity(pvVar4,(to - from) + append_data->row_count);
  if ((format->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask !=
      (unsigned_long *)0x0) {
    pvVar4 = vector<duckdb::ArrowBuffer,_true>::operator[](&append_data->arrow_buffers,0);
    if (from < to) {
      pdVar1 = pvVar4->dataptr;
      bVar5 = (byte)append_data->row_count & 7;
      uVar6 = append_data->row_count >> 3;
      do {
        psVar2 = format->sel->sel_vector;
        iVar7 = from;
        if (psVar2 != (sel_t *)0x0) {
          iVar7 = (idx_t)psVar2[from];
        }
        puVar3 = (format->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((puVar3[iVar7 >> 6] >> (iVar7 & 0x3f) & 1) == 0)) {
          pdVar1[uVar6] = pdVar1[uVar6] & ~(byte)(1L << (bVar5 & 0x3f));
          append_data->null_count = append_data->null_count + 1;
        }
        bVar5 = bVar5 + 1;
        bVar8 = bVar5 == 8;
        if (bVar8) {
          bVar5 = 0;
        }
        uVar6 = uVar6 + bVar8;
        from = from + 1;
      } while (to != from);
    }
  }
  return;
}

Assistant:

static void AppendValidity(ArrowAppendData &append_data, UnifiedVectorFormat &format, idx_t from, idx_t to) {
	// resize the buffer, filling the validity buffer with all valid values
	idx_t size = to - from;
	ResizeValidity(append_data.GetValidityBuffer(), append_data.row_count + size);
	if (format.validity.AllValid()) {
		// if all values are valid we don't need to do anything else
		return;
	}

	// otherwise we iterate through the validity mask
	auto validity_data = (uint8_t *)append_data.GetValidityBuffer().data();
	uint8_t current_bit;
	idx_t current_byte;
	GetBitPosition(append_data.row_count, current_byte, current_bit);
	for (idx_t i = from; i < to; i++) {
		auto source_idx = format.sel->get_index(i);
		// append the validity mask
		if (!format.validity.RowIsValid(source_idx)) {
			SetNull(append_data, validity_data, current_byte, current_bit);
		}
		NextBit(current_byte, current_bit);
	}
}